

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

uint __thiscall AmpIO::GetReadNumBytes(AmpIO *this)

{
  uint32_t uVar1;
  int iVar2;
  
  uVar1 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar1 < 7) {
    iVar2 = this->NumEncoders * 4 + 4;
  }
  else if (uVar1 == 7) {
    iVar2 = this->NumEncoders * 6 + 4;
  }
  else {
    iVar2 = this->NumEncoders * 5 + this->NumMotors * 2 + 4;
  }
  return iVar2 << 2;
}

Assistant:

unsigned int AmpIO::GetReadNumBytes() const
{
    uint32_t fver = GetFirmwareVersion();
    unsigned int numQuads;
    if (fver < 7) {
        numQuads = 4 + 4*NumEncoders;
    } else if (fver == 7) {
        numQuads = 4 + 6*NumEncoders;
    }
    else {
        numQuads = 4 + 2*NumMotors + 5*NumEncoders;
    }
    return numQuads * sizeof(quadlet_t);
}